

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderVariableManagerGL::CheckResources
          (ShaderVariableManagerGL *this,IResourceMapping *pResourceMapping,
          BIND_SHADER_RESOURCES_FLAGS Flags,SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  Uint32 ResIndex;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *pSVar1;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *pSVar2;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *pSVar3;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_00;
  uint uVar4;
  BIND_SHADER_RESOURCES_FLAGS Flags_00;
  uint uVar5;
  Uint32 UVar6;
  uint uVar7;
  uint uVar8;
  
  Flags_00 = Flags | BIND_SHADER_RESOURCES_UPDATE_ALL;
  if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) != 0) {
    Flags_00 = Flags;
  }
  uVar8 = (uint)(((this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                 m_ResourceCache)->m_ContentType == SRB) * 5 + 1;
  if (0x17 < this->m_TextureOffset) {
    pSVar1 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
              *)GetConstResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>(this,0);
    ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
    ::CheckResources(pSVar1,pResourceMapping,Flags_00,StaleVarTypes);
    if ((uVar8 & ~*StaleVarTypes) == 0) {
      return;
    }
    UVar6 = 1;
    do {
      ResIndex = UVar6;
      uVar7 = this->m_TextureOffset / 0x18;
      if (uVar7 <= ResIndex) goto LAB_0030a627;
      pSVar1 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                *)GetConstResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
                            (this,ResIndex);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(pSVar1,pResourceMapping,Flags_00,StaleVarTypes);
      UVar6 = ResIndex + 1;
    } while ((uVar8 & ~*StaleVarTypes) != 0);
    if (ResIndex < uVar7) {
      return;
    }
  }
LAB_0030a627:
  if ((int)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) / 0x18) != 0) {
    pSVar2 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
              *)GetConstResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,0);
    ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
    ::CheckResources(pSVar2,pResourceMapping,Flags_00,StaleVarTypes);
    if ((uVar8 & ~*StaleVarTypes) == 0) {
      return;
    }
    uVar7 = 1;
    do {
      uVar4 = uVar7;
      uVar5 = (uint)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) / 0x18);
      if (uVar5 <= uVar4) goto LAB_0030a6d4;
      pSVar2 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                *)GetConstResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,uVar4);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(pSVar2,pResourceMapping,Flags_00,StaleVarTypes);
      uVar7 = uVar4 + 1;
    } while ((uVar8 & ~*StaleVarTypes) != 0);
    if (uVar4 < uVar5) {
      return;
    }
  }
LAB_0030a6d4:
  if ((int)(((ulong)this->m_StorageBufferOffset - (ulong)this->m_ImageOffset) / 0x18) != 0) {
    pSVar3 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
              *)GetConstResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this,0);
    ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
    ::CheckResources(pSVar3,pResourceMapping,Flags_00,StaleVarTypes);
    if ((uVar8 & ~*StaleVarTypes) == 0) {
      return;
    }
    uVar7 = 1;
    do {
      uVar4 = uVar7;
      uVar5 = (uint)(((ulong)this->m_StorageBufferOffset - (ulong)this->m_ImageOffset) / 0x18);
      if (uVar5 <= uVar4) goto LAB_0030a77d;
      pSVar3 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                *)GetConstResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this,uVar4);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(pSVar3,pResourceMapping,Flags_00,StaleVarTypes);
      uVar7 = uVar4 + 1;
    } while ((uVar8 & ~*StaleVarTypes) != 0);
    if (uVar4 < uVar5) {
      return;
    }
  }
LAB_0030a77d:
  if ((int)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset) / 0x18) != 0) {
    UVar6 = 0;
    do {
      this_00 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *)GetConstResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                             (this,UVar6);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(this_00,pResourceMapping,Flags_00,StaleVarTypes);
      if ((uVar8 & ~*StaleVarTypes) == 0) {
        return;
      }
      UVar6 = UVar6 + 1;
    } while (UVar6 < (uint)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset)
                           / 0x18));
  }
  return;
}

Assistant:

void ShaderVariableManagerGL::CheckResources(IResourceMapping*                    pResourceMapping,
                                             BIND_SHADER_RESOURCES_FLAGS          Flags,
                                             SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
{
    if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
        Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

    const auto AllowedTypes = m_ResourceCache.GetContentType() == ResourceCacheContentType::SRB ?
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN :
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;

    HandleConstResources(
        [&](const UniformBuffBindInfo& ub) {
            ub.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const TextureBindInfo& tex) {
            tex.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const ImageBindInfo& img) {
            img.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const StorageBufferBindInfo& ssbo) {
            ssbo.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        });
}